

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void new_priptr(ObjectUnit *ou,char *sec,char *label,int pri,char *xref,lword addend)

{
  node *n;
  undefined4 in_ECX;
  node *in_RDX;
  node *in_RSI;
  long in_RDI;
  node *in_R8;
  node *in_R9;
  PriPointer *newpp;
  
  n = (node *)alloc((size_t)in_R9);
  n[1].next = in_RSI;
  n[1].pred = in_RDX;
  *(undefined4 *)&n[2].next = in_ECX;
  n[2].pred = in_R8;
  n[3].next = in_R9;
  addtail((list *)(in_RDI + 0x68),n);
  return;
}

Assistant:

static void new_priptr(struct ObjectUnit *ou,const char *sec,const char *label,
                       int pri,const char *xref,lword addend)
/* Inserts a new longword into the object's PriPointers list. */
{
  struct PriPointer *newpp = alloc(sizeof(struct PriPointer));

  newpp->secname = sec;
  newpp->listname = label;
  newpp->priority = pri;
  newpp->xrefname = xref;
  newpp->addend = addend;
  addtail(&ou->pripointers,&newpp->n);
}